

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vktSpvAsmInstructionTests.cpp
# Opt level: O0

ShaderPermutation vkt::SpirVAssembly::getShaderPermutation(deUint8 inputValue)

{
  undefined4 local_d;
  deUint8 inputValue_local;
  ShaderPermutation permutation;
  
  local_d = CONCAT13((char)((inputValue & 2) >> 1),
                     CONCAT12((char)((inputValue & 4) >> 2),
                              CONCAT11((char)((inputValue & 8) >> 3),
                                       (char)((inputValue & 0x10) >> 4))));
  return (ShaderPermutation)(CONCAT14(inputValue,local_d) & 0x1ffffffff);
}

Assistant:

ShaderPermutation getShaderPermutation(deUint8 inputValue)
{
	ShaderPermutation	permutation =
	{
		static_cast<deUint8>(inputValue & 0x10? 1u: 0u),
		static_cast<deUint8>(inputValue & 0x08? 1u: 0u),
		static_cast<deUint8>(inputValue & 0x04? 1u: 0u),
		static_cast<deUint8>(inputValue & 0x02? 1u: 0u),
		static_cast<deUint8>(inputValue & 0x01? 1u: 0u)
	};
	return permutation;
}